

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::Compaction::IsTrivialMove(Compaction *this)

{
  pointer ppFVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if ((((long)this->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)this->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 8) &&
     (((long)this->inputs_[1].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)this->inputs_[1].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 0)) {
    ppFVar1 = (this->grandparents_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->grandparents_).
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
    if (lVar2 == 0) {
      lVar3 = 0;
    }
    else {
      lVar2 = lVar2 >> 3;
      lVar4 = 0;
      lVar3 = 0;
      do {
        lVar3 = lVar3 + ppFVar1[lVar4]->file_size;
        lVar4 = lVar4 + 1;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
    }
    return lVar3 <= (long)(this->input_version_->vset_->options_->max_file_size * 10);
  }
  return false;
}

Assistant:

bool Compaction::IsTrivialMove() const {
  const VersionSet* vset = input_version_->vset_;
  // Avoid a move if there is lots of overlapping grandparent data.
  // Otherwise, the move could create a parent file that will require
  // a very expensive merge later on.
  return (num_input_files(0) == 1 && num_input_files(1) == 0 &&
          TotalFileSize(grandparents_) <=
              MaxGrandParentOverlapBytes(vset->options_));
}